

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall MyP2PClientConnection::OnTick(MyP2PClientConnection *this,uint64_t nowUsec)

{
  int iVar1;
  SDKConnection *in_RDI;
  TonkStatus status;
  SDKConnection *in_stack_000002d0;
  
  iVar1 = *(int *)&in_RDI[1]._vptr_SDKConnection + 1;
  *(int *)&in_RDI[1]._vptr_SDKConnection = iVar1;
  if (99 < iVar1) {
    *(undefined4 *)&in_RDI[1]._vptr_SDKConnection = 0;
    test::LogTonkStatus(in_stack_000002d0);
  }
  tonk::SDKConnection::GetStatus(in_RDI);
  return;
}

Assistant:

void MyP2PClientConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (++StatusLogCounter >= 100)
    {
        StatusLogCounter = 0;
        LogTonkStatus(this);
    }

    TonkStatus status = GetStatus();

#ifdef TONK_ENABLE_1MBPS_DATA_CLIENT
    if (status.LowPriQueueMsec < kLowPriQueueDepthMsec)
    {
        unsigned fillMsec = kLowPriQueueDepthMsec - status.LowPriQueueMsec;
        unsigned bytes = (unsigned)(((uint64_t)status.AppBPS * fillMsec) / 1000);
        unsigned packetsToSend = (bytes + kLowPriBulkData_Bytes - 1) / kLowPriBulkData_Bytes;
        for (unsigned i = 0; i < packetsToSend; ++i)
        {
            uint8_t data[kLowPriBulkData_Bytes] = {};
            for (unsigned i = 0; i < kLowPriBulkData_Bytes; ++i) {
                data[i] = (uint8_t)i;
            }

            const uint16_t ts16 = ToRemoteTime16(nowUsec);
            const uint32_t ts23 = ToRemoteTime23(nowUsec);

            data[0] = (status.Flags & TonkFlag_TimeSync) ? ID_LowPriBulkData_HasTimestamp : ID_LowPriBulkData_NoTimestamp;
            tonk::WriteU16_LE(data + 1, ts16);
            tonk::WriteU24_LE(data + 1 + 2, ts23);
            tonk::WriteU24_LE(data + 1 + 2 + 3, kLowPriBulkMagic);
            tonk::WriteU32_LE(data + 1 + 2 + 3 + 3, NextOutgoingWord++);

            t_tonk_send.BeginCall();
            Send(data, sizeof(data), kLowPriBulkData_Channel);
            t_tonk_send.EndCall();
        }
    }
#endif
}